

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O3

Vector __thiscall Vector::operator+(Vector *this,Vector *v)

{
  Vector VVar1;
  
  VVar1.m_vec[0] = v->m_vec[0] + this->m_vec[0];
  VVar1.m_vec[1] = (float)*(undefined8 *)(v->m_vec + 1) + (float)*(undefined8 *)(this->m_vec + 1);
  VVar1.m_length = -1.0;
  VVar1.m_vec[2] =
       (float)((ulong)*(undefined8 *)(v->m_vec + 1) >> 0x20) +
       (float)((ulong)*(undefined8 *)(this->m_vec + 1) >> 0x20);
  return VVar1;
}

Assistant:

float Y() const { return m_vec[1]; }